

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O0

char * Memdup(char *data,size_t len)

{
  char *p;
  size_t len_local;
  char *data_local;
  
  data_local = (char *)malloc(len + 1);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    if (len != 0) {
      memcpy(data_local,data,len);
    }
    data_local[len] = '\0';
  }
  return data_local;
}

Assistant:

static char *Memdup(const char *data, size_t len)
{
  char *p = malloc(len + 1);
  if(!p)
    return NULL;
  if(len)
    memcpy(p, data, len);
  p[len] = 0;
  return p;
}